

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_suite::test_linear_decrease(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe88;
  double local_160;
  value_type local_158;
  value_type local_150;
  double local_140;
  value_type local_138;
  value_type local_130;
  double local_120;
  value_type local_118;
  value_type local_110;
  double local_100;
  value_type local_f8;
  value_type local_f0;
  double local_e0;
  value_type local_d8;
  value_type local_d0;
  double local_c0;
  value_type local_b8;
  value_type local_b0;
  double local_a0;
  value_type local_98;
  value_type local_90;
  double local_80;
  value_type local_78;
  value_type local_70;
  double local_60;
  value_type local_58;
  value_type local_50;
  double local_40;
  value_type local_38;
  undefined1 local_30 [8];
  moment<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_30,0.125);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,10.0);
  local_38 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_40 = 10.0;
  local_50 = filter.sum.mean;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x98,0x11166a,(char *)&local_38,&local_40,in_stack_fffffffffffffe88,
             predicate_08);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,9.0);
  local_58 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_60 = 9.46667;
  local_70 = filter.sum.mean;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","9.46667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x9a,0x11166a,(char *)&local_58,&local_60,in_stack_fffffffffffffe88,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,8.0);
  local_78 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_80 = 8.91124;
  local_90 = filter.sum.mean;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.91124","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x9c,0x11166a,(char *)&local_78,&local_80,in_stack_fffffffffffffe88,
             predicate_06);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,7.0);
  local_98 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_a0 = 8.33392;
  local_b0 = filter.sum.mean;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","8.33392","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x9e,0x11166a,(char *)&local_98,&local_a0,in_stack_fffffffffffffe88,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,6.0);
  local_b8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_c0 = 7.73498;
  local_d0 = filter.sum.mean;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.73498","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa0,0x11166a,(char *)&local_b8,&local_c0,in_stack_fffffffffffffe88,
             predicate_04);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,5.0);
  local_d8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_e0 = 7.11475;
  local_f0 = filter.sum.mean;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","7.11475","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa2,0x11166a,(char *)&local_d8,&local_e0,in_stack_fffffffffffffe88,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,4.0);
  local_f8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_100 = 6.47365;
  local_110 = filter.sum.mean;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.47365","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa4,0x11166a,(char *)&local_f8,&local_100,in_stack_fffffffffffffe88,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,3.0);
  local_118 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_120 = 5.81214;
  local_130 = filter.sum.mean;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.81214","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa6,0x11166a,(char *)&local_118,&local_120,in_stack_fffffffffffffe88,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_138 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_140 = 5.13076;
  local_150 = filter.sum.mean;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.13076","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xa8,0x11166a,(char *)&local_138,&local_140,in_stack_fffffffffffffe88,
             predicate_00);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_158 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_160 = 4.43009;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.43009","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0xaa,0x11166a,(char *)&local_158,&local_160,in_stack_fffffffffffffe88,
             predicate);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment<double> filter(one_over_eight);

    filter.push(10.0);
    TRIAL_TEST_WITH(filter.mean(), 10.0, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 9.46667, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 8.91124, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 8.33392, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 7.73498, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 7.11475, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 6.47365, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 5.81214, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 5.13076, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 4.43009, tolerance);
}